

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase107::run(TestCase107 *this)

{
  size_t sVar1;
  TestObject *pTVar2;
  TestObject *pTVar3;
  ArrayPtr<kj::(anonymous_namespace)::TestObject> AVar4;
  int local_a8;
  bool local_a1;
  int local_a0;
  bool _kj_shouldLog_4;
  TestObject *pTStack_98;
  bool _kj_shouldLog_3;
  TestObject *local_90;
  bool local_81;
  size_t sStack_80;
  bool _kj_shouldLog_2;
  uint local_78;
  bool local_71;
  size_t sStack_70;
  bool _kj_shouldLog_1;
  uint local_68;
  bool local_61;
  undefined1 auStack_60 [7];
  bool _kj_shouldLog;
  ArrayPtr<kj::(anonymous_namespace)::TestObject> arr2;
  undefined1 local_40 [8];
  ArrayPtr<kj::(anonymous_namespace)::TestObject> arr1;
  Arena arena;
  TestCase107 *this_local;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Arena::Arena((Arena *)&arr1.size_,0x400);
  AVar4 = Arena::allocateArray<kj::(anonymous_namespace)::TestObject>((Arena *)&arr1.size_,4);
  arr1.ptr = (TestObject *)AVar4.size_;
  local_40 = (undefined1  [8])AVar4.ptr;
  AVar4 = Arena::allocateArray<kj::(anonymous_namespace)::TestObject>((Arena *)&arr1.size_,2);
  arr2.ptr = (TestObject *)AVar4.size_;
  _auStack_60 = AVar4.ptr;
  sVar1 = ArrayPtr<kj::(anonymous_namespace)::TestObject>::size
                    ((ArrayPtr<kj::(anonymous_namespace)::TestObject> *)local_40);
  if (sVar1 != 4) {
    local_61 = _::Debug::shouldLog(ERROR);
    while (local_61 != false) {
      local_68 = 4;
      sStack_70 = ArrayPtr<kj::(anonymous_namespace)::TestObject>::size
                            ((ArrayPtr<kj::(anonymous_namespace)::TestObject> *)local_40);
      _::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x73,ERROR,"\"failed: expected \" \"(4u) == (arr1.size())\", 4u, arr1.size()",
                 (char (*) [39])"failed: expected (4u) == (arr1.size())",&local_68,
                 &stack0xffffffffffffff90);
      local_61 = false;
    }
  }
  sVar1 = ArrayPtr<kj::(anonymous_namespace)::TestObject>::size
                    ((ArrayPtr<kj::(anonymous_namespace)::TestObject> *)auStack_60);
  if (sVar1 != 2) {
    local_71 = _::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      local_78 = 2;
      sStack_80 = ArrayPtr<kj::(anonymous_namespace)::TestObject>::size
                            ((ArrayPtr<kj::(anonymous_namespace)::TestObject> *)auStack_60);
      _::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x74,ERROR,"\"failed: expected \" \"(2u) == (arr2.size())\", 2u, arr2.size()",
                 (char (*) [39])"failed: expected (2u) == (arr2.size())",&local_78,
                 &stack0xffffffffffffff80);
      local_71 = false;
    }
  }
  pTVar2 = ArrayPtr<kj::(anonymous_namespace)::TestObject>::end
                     ((ArrayPtr<kj::(anonymous_namespace)::TestObject> *)local_40);
  pTVar3 = ArrayPtr<kj::(anonymous_namespace)::TestObject>::begin
                     ((ArrayPtr<kj::(anonymous_namespace)::TestObject> *)auStack_60);
  if (pTVar3 < pTVar2) {
    local_81 = _::Debug::shouldLog(ERROR);
    while (local_81 != false) {
      local_90 = ArrayPtr<kj::(anonymous_namespace)::TestObject>::end
                           ((ArrayPtr<kj::(anonymous_namespace)::TestObject> *)local_40);
      pTStack_98 = ArrayPtr<kj::(anonymous_namespace)::TestObject>::begin
                             ((ArrayPtr<kj::(anonymous_namespace)::TestObject> *)auStack_60);
      _::Debug::
      log<char_const(&)[48],kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x75,ERROR,
                 "\"failed: expected \" \"(arr1.end()) <= (arr2.begin())\", arr1.end(), arr2.begin()"
                 ,(char (*) [48])"failed: expected (arr1.end()) <= (arr2.begin())",&local_90,
                 &stack0xffffffffffffff68);
      local_81 = false;
    }
  }
  if ((anonymous_namespace)::TestObject::count != 6) {
    _kj_shouldLog_4 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_a0 = 6;
      _::Debug::log<char_const(&)[44],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(6) == (TestObject::count)\", 6, TestObject::count",
                 (char (*) [44])"failed: expected (6) == (TestObject::count)",&local_a0,
                 &(anonymous_namespace)::TestObject::count);
      _kj_shouldLog_4 = false;
    }
  }
  Arena::~Arena((Arena *)&arr1.size_);
  if ((anonymous_namespace)::TestObject::count != 0) {
    local_a1 = _::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      local_a8 = 0;
      _::Debug::log<char_const(&)[44],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x79,ERROR,
                 "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
                 (char (*) [44])"failed: expected (0) == (TestObject::count)",&local_a8,
                 &(anonymous_namespace)::TestObject::count);
      local_a1 = false;
    }
  }
  return;
}

Assistant:

TEST(AsyncIo, AddressParsing) {
  auto ioContext = setupAsyncIo();
  auto& w = ioContext.waitScope;
  auto& network = ioContext.provider->getNetwork();

  EXPECT_EQ("*:0", tryParse(w, network, "*"));
  EXPECT_EQ("*:123", tryParse(w, network, "*:123"));
  EXPECT_EQ("0.0.0.0:0", tryParse(w, network, "0.0.0.0"));
  EXPECT_EQ("1.2.3.4:5678", tryParse(w, network, "1.2.3.4", 5678));

#if !_WIN32
  EXPECT_EQ("unix:foo/bar/baz", tryParse(w, network, "unix:foo/bar/baz"));
  EXPECT_EQ("unix-abstract:foo/bar/baz", tryParse(w, network, "unix-abstract:foo/bar/baz"));
#endif

  // We can parse services by name...
  //
  // For some reason, Android and some various Linux distros do not support service names.
  if (systemSupportsAddress("1.2.3.4", "http")) {
    EXPECT_EQ("1.2.3.4:80", tryParse(w, network, "1.2.3.4:http", 5678));
    EXPECT_EQ("*:80", tryParse(w, network, "*:http", 5678));
  } else {
    KJ_LOG(WARNING, "system does not support resolving service names on ipv4; skipping tests");
  }

  // IPv6 tests. Annoyingly, these don't work on machines that don't have IPv6 configured on any
  // interfaces.
  if (systemSupportsAddress("::")) {
    EXPECT_EQ("[::]:123", tryParse(w, network, "0::0", 123));
    EXPECT_EQ("[12ab:cd::34]:321", tryParse(w, network, "[12ab:cd:0::0:34]:321", 432));
    if (systemSupportsAddress("12ab:cd::34", "http")) {
      EXPECT_EQ("[::]:80", tryParse(w, network, "[::]:http", 5678));
      EXPECT_EQ("[12ab:cd::34]:80", tryParse(w, network, "[12ab:cd::34]:http", 5678));
    } else {
      KJ_LOG(WARNING, "system does not support resolving service names on ipv6; skipping tests");
    }
  } else {
    KJ_LOG(WARNING, "system does not support ipv6; skipping tests");
  }

  // It would be nice to test DNS lookup here but the test would not be very hermetic.  Even
  // localhost can map to different addresses depending on whether IPv6 is enabled.  We do
  // connect to "localhost" in a different test, though.
}